

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestGeodesicArcIntersect.cpp
# Opt level: O3

bool ParseTestGeodesicArcIntersect(string *sString)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  double dVar2;
  double dVar3;
  double dVar4;
  char *pcVar5;
  size_type sVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ostream *poVar12;
  long *plVar13;
  char *pcVar14;
  char *__n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var15;
  ulong __n_00;
  char *unaff_R12;
  char *unaff_R13;
  pointer unaff_R15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [12];
  LLPoint intPtC1;
  string soTestId;
  string soIntersection1Lat;
  string sIntPt2Lat;
  string soIntersection2Lon;
  string soIntersection2Lat;
  string soIntersection1Lon;
  LLPoint intPtC2;
  LLPoint geodesicStart;
  string soArcCenterLon;
  string soArcCenterLat;
  string soGeodesicStartLon;
  string soGeodesicStartLat;
  LLPoint arcCenter;
  string soArcRadius;
  string soGeodesicAzimuth;
  int sub_matches [13];
  sregex_token_iterator it;
  sregex_token_iterator s_end;
  LLPoint pt;
  LLPoint local_5d8;
  undefined1 local_5c8 [24];
  char *local_5b0;
  long local_5a8;
  char local_5a0 [16];
  char *local_590;
  char *local_588;
  char local_580 [16];
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_570;
  char *local_4e8;
  ulong local_4e0;
  char local_4d8 [16];
  char *local_4c8;
  char *local_4c0;
  char local_4b8 [16];
  char *local_4a8;
  char *local_4a0;
  char local_498 [16];
  LLPoint local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  double local_450;
  undefined1 *local_448;
  long local_440;
  undefined1 local_438 [16];
  undefined1 *local_428;
  long local_420;
  undefined1 local_418 [16];
  undefined1 *local_408;
  long local_400;
  undefined1 local_3f8 [16];
  undefined1 *local_3e8;
  long local_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [32];
  char *local_3a8;
  undefined8 local_3a0;
  char local_398 [16];
  char *local_388;
  undefined8 local_380;
  char local_378 [16];
  string local_368;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 local_338;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_328;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  double local_e0;
  undefined1 local_d8 [32];
  pointer local_b8;
  pointer psStack_b0;
  pointer local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_a0;
  pointer local_98;
  pointer piStack_90;
  pointer piStack_88;
  undefined1 uStack_80;
  undefined7 local_7f;
  undefined1 uStack_78;
  undefined8 uStack_77;
  size_t local_68;
  value_type *pvStack_60;
  bool local_58;
  
  lVar10 = std::__cxx11::string::find_last_not_of((char *)sString,0x15b244,0xffffffffffffffff);
  uVar11 = lVar10 + 1;
  if (sString->_M_string_length < uVar11) {
    auVar18 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar11);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_570);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)local_d8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_328);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_3c8);
    if (local_470._M_dataplus._M_p != unaff_R15) {
      operator_delete(local_470._M_dataplus._M_p);
    }
    if (auVar18._8_4_ != 1) {
      if (local_4e8 != unaff_R13) {
        operator_delete(local_4e8);
      }
      if (local_4c8 != unaff_R12) {
        operator_delete(local_4c8);
      }
      if (local_4a8 != local_498) {
        operator_delete(local_4a8);
      }
      if (local_590 != local_580) {
        operator_delete(local_590);
      }
      if (local_3a8 != local_398) {
        operator_delete(local_3a8);
      }
      if (local_448 != local_438) {
        operator_delete(local_448);
      }
      if (local_428 != local_418) {
        operator_delete(local_428);
      }
      if (local_388 != local_378) {
        operator_delete(local_388);
      }
      if (local_408 != local_3f8) {
        operator_delete(local_408);
      }
      if (local_3e8 != local_3d8) {
        operator_delete(local_3e8);
      }
      if (local_5b0 != local_5a0) {
        operator_delete(local_5b0);
      }
      _Unwind_Resume(auVar18._0_8_);
    }
    plVar13 = (long *)__cxa_begin_catch(auVar18._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    pcVar14 = (char *)(**(code **)(*plVar13 + 0x10))(plVar13);
    std::operator<<((ostream *)&std::cout,pcVar14);
    __cxa_end_catch();
    bVar8 = false;
    goto LAB_0013981d;
  }
  sString->_M_string_length = uVar11;
  (sString->_M_dataplus)._M_p[uVar11] = '\0';
  std::__cxx11::string::find_first_not_of((char *)sString,0x15b244,0);
  std::__cxx11::string::erase((ulong)sString,0);
  local_5b0 = local_5a0;
  local_5a8 = 0;
  local_5a0[0] = '\0';
  local_3e8 = local_3d8;
  local_3e0 = 0;
  local_3d8[0] = 0;
  local_408 = local_3f8;
  local_400 = 0;
  local_3f8[0] = 0;
  local_388 = local_378;
  local_380 = 0;
  local_378[0] = '\0';
  local_428 = local_418;
  local_420 = 0;
  local_418[0] = 0;
  local_448 = local_438;
  local_440 = 0;
  local_438[0] = 0;
  local_3a8 = local_398;
  local_3a0 = 0;
  local_398[0] = '\0';
  local_590 = local_580;
  local_588 = (char *)0x0;
  local_580[0] = '\0';
  local_4a8 = local_498;
  local_4a0 = (char *)0x0;
  local_498[0] = '\0';
  unaff_R12 = local_4b8;
  local_4c0 = (char *)0x0;
  local_4b8[0] = '\0';
  unaff_R13 = local_4d8;
  local_4e0 = 0;
  local_4d8[0] = '\0';
  local_4e8 = unaff_R13;
  local_4c8 = unaff_R12;
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"([a-z]*|[A-Z]*\\d*)[,]","");
  std::__cxx11::string::append((char *)&local_470);
  std::__cxx11::string::append((char *)&local_470);
  std::__cxx11::string::append((char *)&local_470);
  std::__cxx11::string::append((char *)&local_470);
  std::__cxx11::string::append((char *)&local_470);
  std::__cxx11::string::append((char *)&local_470);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_3c8,&local_470,0x11);
  local_348 = 0xa00000009;
  uStack_340 = 0xc0000000b;
  local_368.field_2._M_allocated_capacity = 0x600000005;
  local_368.field_2._8_8_ = 0x800000007;
  local_368._M_dataplus._M_p = (char *)0x200000001;
  local_368._M_string_length = 0x400000003;
  local_338 = 0xd;
  _Var1._M_current = (sString->_M_dataplus)._M_p;
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<13ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)&local_328,_Var1,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_Var1._M_current + sString->_M_string_length),(regex_type *)local_3c8,
             (int (*) [13])&local_368,0);
  uStack_78 = 0;
  uStack_77 = 0;
  piStack_88 = (pointer)0x0;
  uStack_80 = 0;
  local_7f = 0;
  local_98 = (pointer)0x0;
  piStack_90 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  _Stack_a0._M_current = (char *)0x0;
  local_b8 = (pointer)0x0;
  psStack_b0 = (pointer)0x0;
  local_d8._16_8_ = (regex_type *)0x0;
  local_d8._24_8_ = 0;
  local_d8._0_8_ = (char *)0x0;
  local_d8._8_8_ = (char *)0x0;
  local_68 = 0;
  pvStack_60 = (value_type *)0x0;
  local_58 = false;
  bVar8 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator==(&local_328,
                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_d8);
  if (!bVar8) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    local_5d8.latitude = (double)local_5c8;
    if ((local_570._M_result)->matched == true) {
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
    }
    std::__cxx11::string::operator=((string *)&local_5b0,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    if ((local_570._M_result)->matched == true) {
      local_5d8.latitude = (double)local_5c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
      local_5d8.latitude = (double)local_5c8;
    }
    std::__cxx11::string::operator=((string *)&local_3e8,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    if ((local_570._M_result)->matched == true) {
      local_5d8.latitude = (double)local_5c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
      local_5d8.latitude = (double)local_5c8;
    }
    std::__cxx11::string::operator=((string *)&local_408,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    if ((local_570._M_result)->matched == true) {
      local_5d8.latitude = (double)local_5c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
      local_5d8.latitude = (double)local_5c8;
    }
    std::__cxx11::string::operator=((string *)&local_388,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    if ((local_570._M_result)->matched == true) {
      local_5d8.latitude = (double)local_5c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
      local_5d8.latitude = (double)local_5c8;
    }
    std::__cxx11::string::operator=((string *)&local_428,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    if ((local_570._M_result)->matched == true) {
      local_5d8.latitude = (double)local_5c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
      local_5d8.latitude = (double)local_5c8;
    }
    std::__cxx11::string::operator=((string *)&local_448,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    if ((local_570._M_result)->matched == true) {
      local_5d8.latitude = (double)local_5c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
      local_5d8.latitude = (double)local_5c8;
    }
    std::__cxx11::string::operator=((string *)&local_3a8,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    if ((local_570._M_result)->matched == true) {
      local_5d8.latitude = (double)local_5c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
      local_5d8.latitude = (double)local_5c8;
    }
    std::__cxx11::string::operator=((string *)&local_590,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    if ((local_570._M_result)->matched == true) {
      local_5d8.latitude = (double)local_5c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
      local_5d8.latitude = (double)local_5c8;
    }
    std::__cxx11::string::operator=((string *)&local_4a8,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    if ((local_570._M_result)->matched == true) {
      local_5d8.latitude = (double)local_5c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
      local_5d8.latitude = (double)local_5c8;
    }
    std::__cxx11::string::operator=((string *)&local_4c8,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_570,&local_328,0);
    if ((local_570._M_result)->matched == true) {
      local_5d8.latitude = (double)local_5c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_5d8,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 ((local_570._M_result)->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_5d8.longitude = 0.0;
      local_5c8[0] = 0;
      local_5d8.latitude = (double)local_5c8;
    }
    std::__cxx11::string::operator=((string *)&local_4e8,(string *)&local_5d8);
    if ((undefined1 *)local_5d8.latitude != local_5c8) {
      operator_delete((void *)local_5d8.latitude);
    }
    if (local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_570._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98);
  }
  if (local_b8 != (pointer)0x0) {
    operator_delete(local_b8);
  }
  if (local_328._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_328._M_position._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328._M_position._M_match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_100,local_3e8,local_3e8 + local_3e0);
  dVar2 = ParseLatitude(&local_100);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_408,local_408 + local_400);
  local_470._M_string_length = (size_type)ParseLongitude(&local_120);
  local_470._M_dataplus._M_p = (pointer)(dVar2 * 0.017453292519943295);
  local_470._M_string_length =
       (size_type)((double)local_470._M_string_length * 0.017453292519943295);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_140,local_428,local_428 + local_420);
  dVar2 = ParseLatitude(&local_140);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_160,local_448,local_448 + local_440);
  local_3c8._8_8_ = ParseLongitude(&local_160);
  local_3c8._0_8_ = dVar2 * 0.017453292519943295;
  local_3c8._8_8_ = (double)local_3c8._8_8_ * 0.017453292519943295;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  dVar2 = atof(local_388);
  local_450 = atof(local_3a8);
  iVar9 = std::__cxx11::string::compare((char *)&local_590);
  if (iVar9 != 0) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_590,local_588 + (long)local_590);
    dVar3 = ParseLatitude(&local_180);
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              (SUB84(dVar3,0),&local_1a0,local_4a8,local_4a0 + (long)local_4a8);
    ParseLongitude(&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,local_4c8,local_4c0 + (long)local_4c8);
    dVar3 = ParseLatitude(&local_1c0);
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              (SUB84(dVar3,0),&local_1e0,local_4e8,local_4e8 + local_4e0);
    ParseLongitude(&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
  }
  local_5d8.latitude = 0.0;
  local_5d8.longitude = 0.0;
  local_488.latitude = 0.0;
  local_488.longitude = 0.0;
  iVar9 = GeoCalcs::GeodesicArcIntercept
                    ((LLPoint *)&local_470,dVar2 * 0.017453292519943295,(LLPoint *)local_3c8,
                     local_450 * 1852.0,&local_5d8,&local_488,1e-09);
  dVar2 = local_5d8.latitude;
  if (iVar9 < 1) {
    iVar9 = std::__cxx11::string::compare((char *)&local_590);
    bVar8 = iVar9 == 0;
    goto LAB_0013981d;
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_4c8,local_4c0 + (long)local_4c8);
  dVar3 = ParseLatitude(&local_200);
  dVar4 = local_5d8.longitude;
  dVar16 = ABS(dVar2);
  dVar17 = ABS(dVar3 * 0.017453292519943295);
  if (dVar16 <= dVar17) {
    dVar17 = dVar16;
  }
  if (ABS(dVar2 - dVar3 * 0.017453292519943295) <= dVar17 * 0.0017453292519943296) {
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_220,local_4e8,local_4e8 + local_4e0);
    dVar2 = ParseLongitude(&local_220);
    dVar17 = ABS(dVar4);
    dVar3 = ABS(dVar2 * 0.017453292519943295);
    if (dVar17 <= dVar3) {
      dVar3 = dVar17;
    }
    bVar8 = ABS(dVar4 - dVar2 * 0.017453292519943295) <= dVar3 * 0.0017453292519943296;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
  }
  else {
    bVar8 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  dVar3 = local_5d8.longitude;
  dVar2 = local_5d8.latitude;
  if (bVar8) {
    local_5d8.latitude = local_488.latitude;
    local_5d8.longitude = local_488.longitude;
    local_488.latitude = dVar2;
    local_488.longitude = dVar3;
  }
  local_d8._0_8_ = local_5d8.latitude * 57.29577951308232;
  ConvertLatitudeDdToDms_abi_cxx11_((string *)&local_328,(double *)local_d8);
  local_570._M_position._M_begin._M_current = (char *)(local_5d8.longitude * 57.29577951308232);
  ConvertLongitudeDdToDms_abi_cxx11_((string *)local_d8,(double *)&local_570);
  local_368._M_dataplus._M_p = (pointer)(local_488.latitude * 57.29577951308232);
  ConvertLatitudeDdToDms_abi_cxx11_((string *)&local_570,(double *)&local_368);
  local_e0 = local_488.longitude * 57.29577951308232;
  ConvertLongitudeDdToDms_abi_cxx11_(&local_368,&local_e0);
  _Var1._M_current = local_328._M_position._M_end._M_current;
  pcVar5 = local_588;
  pcVar14 = local_590;
  _Var15._M_current = local_328._M_position._M_end._M_current;
  if (local_588 < local_328._M_position._M_end._M_current) {
    _Var15._M_current = local_588;
  }
  if (_Var15._M_current == (char *)0x0) {
    bVar8 = true;
    if (local_328._M_position._M_end._M_current != local_588) goto LAB_00139025;
  }
  else {
    iVar9 = bcmp(local_328._M_position._M_begin._M_current,local_590,(size_t)_Var15._M_current);
    if ((_Var1._M_current != pcVar5) || (bVar8 = true, iVar9 != 0)) {
LAB_00139025:
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_240,pcVar14,pcVar5 + (long)pcVar14)
      ;
      dVar2 = ParseLatitude(&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p);
      }
      dVar3 = ABS(dVar2 * 0.017453292519943295);
      dVar17 = ABS(local_5d8.latitude);
      if (dVar3 <= ABS(local_5d8.latitude)) {
        dVar17 = dVar3;
      }
      if (ABS(dVar2 * 0.017453292519943295 - local_5d8.latitude) <= dVar17 * 1e-10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_5b0,local_5a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," within rounding tolerance of 1e-10: Input Intersection 1 latitude: ",
                   0x44);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_590,(long)local_588);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  calced: ",10);
        bVar8 = true;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,local_328._M_position._M_begin._M_current,
                   (long)local_328._M_position._M_end._M_current);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_5b0,local_5a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," failed: Expected Intersection 1 latitude: ",0x2b);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_590,(long)local_588);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  calced: ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,local_328._M_position._M_begin._M_current,
                   (long)local_328._M_position._M_end._M_current);
        bVar8 = false;
      }
    }
  }
  uVar7 = local_d8._8_8_;
  pcVar5 = local_4a0;
  pcVar14 = local_4a8;
  __n = (char *)local_d8._8_8_;
  if (local_4a0 < (ulong)local_d8._8_8_) {
    __n = local_4a0;
  }
  if (__n == (char *)0x0) {
    if ((char *)local_d8._8_8_ != local_4a0) goto LAB_0013921c;
  }
  else {
    iVar9 = bcmp((void *)local_d8._0_8_,local_4a8,(size_t)__n);
    if (((char *)uVar7 != pcVar5) || (iVar9 != 0)) {
LAB_0013921c:
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_260,pcVar14,pcVar5 + (long)pcVar14)
      ;
      dVar2 = ParseLatitude(&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      dVar3 = ABS(dVar2 * 0.017453292519943295);
      dVar17 = ABS(local_5d8.longitude);
      if (dVar3 <= ABS(local_5d8.longitude)) {
        dVar17 = dVar3;
      }
      if (ABS(dVar2 * 0.017453292519943295 - local_5d8.longitude) <= dVar17 * 1e-10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_5b0,local_5a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," within rounding tolerance of 1e-10: Input Intersection 1 longitude: ",
                   0x45);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_4a8,(long)local_4a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  calced: ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,(char *)local_d8._0_8_,local_d8._8_8_);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_5b0,local_5a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," failed: Expected Intersection 1 longitude: ",0x2c);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_4a8,(long)local_4a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  calced: ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,(char *)local_d8._0_8_,local_d8._8_8_);
        bVar8 = false;
      }
    }
  }
  pcVar5 = local_4c0;
  pcVar14 = local_4c8;
  _Var1._M_current = local_570._M_position._M_end._M_current;
  _Var15._M_current = local_570._M_position._M_end._M_current;
  if (local_4c0 < local_570._M_position._M_end._M_current) {
    _Var15._M_current = local_4c0;
  }
  if (_Var15._M_current == (char *)0x0) {
    if (local_570._M_position._M_end._M_current != local_4c0) goto LAB_0013941a;
  }
  else {
    iVar9 = bcmp(local_570._M_position._M_begin._M_current,local_4c8,(size_t)_Var15._M_current);
    if ((_Var1._M_current != pcVar5) || (iVar9 != 0)) {
LAB_0013941a:
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_280,pcVar14,pcVar5 + (long)pcVar14)
      ;
      dVar2 = ParseLatitude(&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      dVar3 = ABS(dVar2 * 0.017453292519943295);
      dVar17 = ABS(local_488.latitude);
      if (dVar3 <= ABS(local_488.latitude)) {
        dVar17 = dVar3;
      }
      if (ABS(dVar2 * 0.017453292519943295 - local_488.latitude) <= dVar17 * 1e-10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_5b0,local_5a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," within rounding tolerance of 1e-10: Input Intersection 2 latitude: ",
                   0x44);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_4c8,(long)local_4c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  calced: ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,local_570._M_position._M_begin._M_current,
                   (long)local_570._M_position._M_end._M_current);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_5b0,local_5a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," failed: Expected Intersection 2 latitude: ",0x2b);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_4c8,(long)local_4c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  calced: ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,local_570._M_position._M_begin._M_current,
                   (long)local_570._M_position._M_end._M_current);
        bVar8 = false;
      }
    }
  }
  sVar6 = local_368._M_string_length;
  uVar11 = local_4e0;
  pcVar14 = local_4e8;
  __n_00 = local_368._M_string_length;
  if (local_4e0 < local_368._M_string_length) {
    __n_00 = local_4e0;
  }
  if (__n_00 == 0) {
    if (local_368._M_string_length != local_4e0) goto LAB_00139618;
  }
  else {
    iVar9 = bcmp(local_368._M_dataplus._M_p,local_4e8,__n_00);
    if ((sVar6 != uVar11) || (iVar9 != 0)) {
LAB_00139618:
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2a0,pcVar14,pcVar14 + uVar11);
      dVar2 = ParseLatitude(&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      dVar3 = ABS(dVar2 * 0.017453292519943295);
      dVar17 = ABS(local_488.longitude);
      if (dVar3 <= ABS(local_488.longitude)) {
        dVar17 = dVar3;
      }
      if (ABS(dVar2 * 0.017453292519943295 - local_488.longitude) <= dVar17 * 1e-10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_5b0,local_5a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," within rounding tolerance of 1e-10: Input Intersection 2 longitude: ",
                   0x45);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_4e8,local_4e0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  calced: ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,local_368._M_dataplus._M_p,local_368._M_string_length);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_5b0,local_5a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," failed: Expected Intersection 2 longitude: ",0x2c);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_4e8,local_4e0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  calced: ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,local_368._M_dataplus._M_p,local_368._M_string_length);
        bVar8 = false;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if ((regex_type **)local_570._M_position._M_begin._M_current != &local_570._M_position._M_pregex)
  {
    operator_delete(local_570._M_position._M_begin._M_current);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((regex_type **)local_328._M_position._M_begin._M_current != &local_328._M_position._M_pregex)
  {
    operator_delete(local_328._M_position._M_begin._M_current);
  }
LAB_0013981d:
  if (local_4e8 != unaff_R13) {
    operator_delete(local_4e8);
  }
  if (local_4c8 != unaff_R12) {
    operator_delete(local_4c8);
  }
  if (local_4a8 != local_498) {
    operator_delete(local_4a8);
  }
  if (local_590 != local_580) {
    operator_delete(local_590);
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8);
  }
  if (local_448 != local_438) {
    operator_delete(local_448);
  }
  if (local_428 != local_418) {
    operator_delete(local_428);
  }
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  if (local_408 != local_3f8) {
    operator_delete(local_408);
  }
  if (local_3e8 != local_3d8) {
    operator_delete(local_3e8);
  }
  if (local_5b0 != local_5a0) {
    operator_delete(local_5b0);
  }
  return bVar8;
}

Assistant:

bool ParseTestGeodesicArcIntersect(string sString)
{
    bool bPassed = true;
    trim(sString);
    string soTestId, soGeodesicStartLat, soGeodesicStartLon;
    string soGeodesicAzimuth, soArcCenterLat, soArcCenterLon;
    string soArcRadius, soIntersection1Lat, soIntersection1Lon;
    string soIntersection2Lat, soIntersection2Lon;

    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-z]*|[A-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";

        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            soTestId = *it++;
            soGeodesicStartLat = *it++;
            soGeodesicStartLon = *it++;
            soGeodesicAzimuth = *it++;
            soArcCenterLat = *it++;
            soArcCenterLon = *it++;
            soArcRadius = *it++;
            soIntersection1Lat = *it++;
            soIntersection1Lon = *it++;
            soIntersection2Lat = *it++;
            soIntersection2Lon = *it++;

        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }

    LLPoint geodesicStart(Deg2Rad(ParseLatitude(soGeodesicStartLat)), Deg2Rad(ParseLongitude(soGeodesicStartLon)));
    LLPoint arcCenter(Deg2Rad(ParseLatitude(soArcCenterLat)), Deg2Rad(ParseLongitude(soArcCenterLon)));
    double geodesicAzimuth = Deg2Rad(atof(soGeodesicAzimuth.c_str()));
    double arcRadius = NmToMeters(atof(soArcRadius.c_str()));
    LLPoint intersection1;
    LLPoint intersection2;
    if (soIntersection1Lat != "N/A")
    {
        intersection1.Set(Deg2Rad(ParseLatitude(soIntersection1Lat)), Deg2Rad(ParseLongitude(soIntersection1Lon)));
        intersection2.Set(Deg2Rad(ParseLatitude(soIntersection2Lat)), Deg2Rad(ParseLongitude(soIntersection2Lon)));
    }

    LLPoint intPtC1, intPtC2;
    int nIndex = GeodesicArcIntercept(geodesicStart, geodesicAzimuth, arcCenter, arcRadius, intPtC1, intPtC2, kTol);
    if (nIndex < 1)
    {
        if (soIntersection1Lat != "N/A")
            bPassed = false;

    }
    else
    {
        if (IsApprox(intPtC1.latitude, Deg2Rad(ParseLatitude(soIntersection2Lat)), Deg2Rad(0.1)) &&
            IsApprox(intPtC1.longitude, Deg2Rad(ParseLongitude(soIntersection2Lon)), Deg2Rad(0.1)))
        {
            LLPoint pt = intPtC1;
            intPtC1 = intPtC2;
            intPtC2 = pt;
        }

        string sIntPt1Lat = ConvertLatitudeDdToDms(Rad2Deg(intPtC1.latitude));
        string sIntPt1Lon = ConvertLongitudeDdToDms(Rad2Deg(intPtC1.longitude));
        string sIntPt2Lat = ConvertLatitudeDdToDms(Rad2Deg(intPtC2.latitude));
        string sIntPt2Lon = ConvertLongitudeDdToDms(Rad2Deg(intPtC2.longitude));

        if (sIntPt1Lat.compare(soIntersection1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(soIntersection1Lat));
            if (IsApprox(dLat, intPtC1.latitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 1 latitude: " <<
                soIntersection1Lat << "  calced: " << sIntPt1Lat;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 1 latitude: " << soIntersection1Lat <<
                "  calced: " << sIntPt1Lat;
                bPassed = false;
            }
        }

        if (sIntPt1Lon.compare(soIntersection1Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLatitude(soIntersection1Lon));
            if (IsApprox(dLon, intPtC1.longitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 1 longitude: " <<
                soIntersection1Lon << "  calced: " << sIntPt1Lon;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 1 longitude: " << soIntersection1Lon <<
                "  calced: " << sIntPt1Lon;
                bPassed = false;
            }
        }

        if (sIntPt2Lat.compare(soIntersection2Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(soIntersection2Lat));
            if (IsApprox(dLat, intPtC2.latitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 2 latitude: " <<
                soIntersection2Lat << "  calced: " << sIntPt2Lat;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 2 latitude: " << soIntersection2Lat <<
                "  calced: " << sIntPt2Lat;
                bPassed = false;
            }
        }

        if (sIntPt2Lon.compare(soIntersection2Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLatitude(soIntersection2Lon));
            if (IsApprox(dLon, intPtC2.longitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 2 longitude: " <<
                soIntersection2Lon << "  calced: " << sIntPt2Lon;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 2 longitude: " << soIntersection2Lon <<
                "  calced: " << sIntPt2Lon;
                bPassed = false;
            }
        }

    }


    return bPassed;
}